

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O1

void Llb_MtrVerifyColumns(Llb_Mtr_t *p,int iGrpStart)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  if (0 < (long)p->nRows) {
    lVar2 = 0;
    do {
      if (p->pProdVars[lVar2] != '\0') {
        iVar3 = 0;
        if (iGrpStart < p->nCols) {
          iVar3 = 0;
          lVar1 = (long)iGrpStart;
          do {
            iVar3 = iVar3 + (uint)(p->pMatrix[lVar1][lVar2] == '\x01');
            lVar1 = lVar1 + 1;
          } while (p->nCols != lVar1);
        }
        if (iVar3 != p->pProdNums[lVar2]) {
          __assert_fail("Counter == p->pProdNums[iVar]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                        ,0xcd,"void Llb_MtrVerifyColumns(Llb_Mtr_t *, int)");
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != p->nRows);
  }
  return;
}

Assistant:

void Llb_MtrVerifyColumns( Llb_Mtr_t * p, int iGrpStart )
{
    int iVar, iGrp, Counter;
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pProdVars[iVar] == 0 )
            continue;
        Counter = 0;
        for ( iGrp = iGrpStart; iGrp < p->nCols; iGrp++ )
            if ( p->pMatrix[iGrp][iVar] == 1 )
                Counter++;
        assert( Counter == p->pProdNums[iVar] );
        if ( Counter != p->pProdNums[iVar] )
            Abc_Print( -1, "Llb_MtrVerifyColumns(): Internal error.\n" );
    }
}